

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O2

bool check_somatic(CHAR_DATA *ch)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  
  iVar1 = get_skill(ch,(int)gsn_somatic_casting);
  if (iVar1 < 5) {
    bVar3 = false;
  }
  else {
    WAIT_STATE(ch,0xc);
    iVar2 = number_percent();
    if ((int)((float)iVar1 * 0.75) < iVar2) {
      bVar3 = false;
      act("$n gestures and focuses intently for a moment, but nothing happens.",ch,(void *)0x0,
          (void *)0x0,0);
      send_to_char("You fail to complete the incantation by using somatic gestures.\n\r",ch);
    }
    else {
      act("$n concentrates intently as $e gestures with $s hands.",ch,(void *)0x0,(void *)0x0,0);
      act("You focus intently, using somatic gestures to complete the incantation.",ch,(void *)0x0,
          (void *)0x0,3);
      check_improve(ch,(int)gsn_somatic_casting,true,6);
      bVar3 = true;
    }
  }
  return bVar3;
}

Assistant:

bool check_somatic(CHAR_DATA *ch)
{
	int skill = get_skill(ch, gsn_somatic_casting);

	if (skill < 5)
		return false;

	skill = (int)((float)skill * 0.75);

	WAIT_STATE(ch, PULSE_VIOLENCE);

	if (number_percent() > skill)
	{
		act("$n gestures and focuses intently for a moment, but nothing happens.", ch, 0, 0, TO_ROOM);
		send_to_char("You fail to complete the incantation by using somatic gestures.\n\r", ch);
		return false;
	}

	act("$n concentrates intently as $e gestures with $s hands.", ch, 0, 0, TO_ROOM);
	act("You focus intently, using somatic gestures to complete the incantation.", ch, 0, 0, TO_CHAR);

	check_improve(ch, gsn_somatic_casting, true, 6);

	return true;
}